

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPtr __thiscall ON_SubD::FirstComponent(ON_SubD *this,Type component_type)

{
  ON_SubDVertex *vertex;
  ON_SubDEdge *edge;
  ON_SubDFace *face;
  Type component_type_local;
  ON_SubD *this_local;
  
  if (component_type == Vertex) {
    vertex = FirstVertex(this);
    this_local = (ON_SubD *)ON_SubDComponentPtr::Create(vertex);
  }
  else if (component_type == Edge) {
    edge = FirstEdge(this);
    this_local = (ON_SubD *)ON_SubDComponentPtr::Create(edge);
  }
  else if (component_type == Face) {
    face = FirstFace(this);
    this_local = (ON_SubD *)ON_SubDComponentPtr::Create(face);
  }
  else {
    this_local = (ON_SubD *)0;
  }
  return (ON_SubDComponentPtr)(ON__UINT_PTR)this_local;
}

Assistant:

const ON_SubDComponentPtr ON_SubD::FirstComponent(
  ON_SubDComponentPtr::Type component_type
) const
{
  switch (component_type)
  {
  case ON_SubDComponentPtr::Type::Vertex:
    return ON_SubDComponentPtr::Create(this->FirstVertex());
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return ON_SubDComponentPtr::Create(this->FirstEdge());
    break;
  case ON_SubDComponentPtr::Type::Face:
    return ON_SubDComponentPtr::Create(this->FirstFace());
    break;
  default:
    break;
  }
  return ON_SubDComponentPtr::Null;
}